

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int __thiscall
fmt::ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int>::visit
          (ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int> *this,Arg *arg)

{
  int iVar1;
  FormatError *this_00;
  ulong uVar2;
  
  switch(*(undefined4 *)(this + 0x10)) {
  case 2:
  case 7:
    uVar2 = (ulong)*(uint *)this;
    break;
  case 3:
    uVar2 = (ulong)*(uint *)this;
    if ((int)*(uint *)this < 0) {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      FormatError::FormatError(this_00,(CStringRef)0x10f500);
LAB_001033b8:
      __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
    }
    break;
  case 4:
    uVar2 = *(ulong *)this;
    if ((long)(int)uVar2 != uVar2) {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      FormatError::FormatError(this_00,(CStringRef)0x10f500);
      goto LAB_001033b8;
    }
    break;
  case 5:
    uVar2 = *(ulong *)this;
    if ((uVar2 & 0xffffffff80000000) != 0) {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      FormatError::FormatError(this_00,(CStringRef)0x10f500);
      goto LAB_001033b8;
    }
    break;
  case 6:
    uVar2 = (ulong)(*(int *)this != 0);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    iVar1 = visit_unhandled_arg(this);
    __cxa_free_exception();
    _Unwind_Resume(iVar1);
  default:
    uVar2 = 0;
  }
  return (int)uVar2;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    case Arg::NONE:
    case Arg::NAMED_ARG:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
    return Result();
  }